

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cali.cpp
# Opt level: O0

void cali_begin_int_byname(char *attr_name,int val)

{
  Variant local_88 [2];
  allocator<char> local_61;
  string local_60;
  Attribute local_40;
  Attribute attr;
  Caliper c;
  int val_local;
  char *attr_name_local;
  
  cali::Caliper::Caliper((Caliper *)&attr);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,attr_name,&local_61);
  local_40 = cali::Caliper::create_attribute
                       ((Caliper *)&attr,&local_60,CALI_TYPE_INT,0,0,(Attribute *)0x0,(Variant *)0x0
                       );
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  cali::Variant::Variant(local_88,val);
  cali::Caliper::begin((Caliper *)&attr,&local_40,local_88);
  cali::Caliper::~Caliper((Caliper *)&attr);
  return;
}

Assistant:

void cali_begin_int_byname(const char* attr_name, int val)
{
    Caliper   c;
    Attribute attr = c.create_attribute(attr_name, CALI_TYPE_INT, CALI_ATTR_DEFAULT);

    c.begin(attr, Variant(val));
}